

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O2

vorbis_info_floor * floor1_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  int *__ptr;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  vorbis_info_floor1 *info;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int *piVar12;
  
  pvVar1 = vi->codec_setup;
  __ptr = (int *)calloc(1,0x448);
  uVar2 = oggpack_read(opb,5);
  *__ptr = (int)uVar2;
  uVar9 = 0;
  uVar11 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar11 = uVar9;
  }
  iVar8 = -1;
  for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
    lVar3 = oggpack_read(opb,4);
    iVar7 = (int)lVar3;
    __ptr[uVar9 + 1] = iVar7;
    if (iVar7 < iVar8) {
      iVar7 = iVar8;
    }
    iVar8 = iVar7;
  }
  piVar12 = __ptr + 0x50;
  lVar3 = 0;
  while( true ) {
    if (iVar8 < lVar3) {
      lVar3 = oggpack_read(opb,2);
      __ptr[0xd0] = (int)lVar3 + 1;
      lVar3 = oggpack_read(opb,4);
      iVar8 = 1 << ((byte)lVar3 & 0x1f);
      lVar10 = 0;
      lVar4 = 0;
      lVar5 = 0;
      do {
        if (*__ptr <= lVar10) {
          __ptr[0xd1] = 0;
          __ptr[0xd2] = iVar8;
          return __ptr;
        }
        lVar4 = (long)(int)lVar4 + (long)__ptr[(long)__ptr[lVar10 + 1] + 0x20];
        for (lVar5 = (long)(int)lVar5; lVar5 < lVar4; lVar5 = lVar5 + 1) {
          lVar6 = oggpack_read(opb,(int)lVar3);
          iVar7 = (int)lVar6;
          __ptr[lVar5 + 0xd3] = iVar7;
          if ((iVar7 < 0) || (iVar8 <= iVar7)) goto LAB_00130eb6;
        }
        lVar10 = lVar10 + 1;
      } while( true );
    }
    lVar4 = oggpack_read(opb,3);
    __ptr[lVar3 + 0x20] = (int)lVar4 + 1;
    lVar4 = oggpack_read(opb,2);
    iVar7 = (int)lVar4;
    __ptr[lVar3 + 0x30] = iVar7;
    if (iVar7 < 0) break;
    if (iVar7 == 0) {
      iVar7 = __ptr[lVar3 + 0x40];
    }
    else {
      lVar4 = oggpack_read(opb,8);
      iVar7 = (int)lVar4;
      __ptr[lVar3 + 0x40] = iVar7;
    }
    if ((iVar7 < 0) || (*(int *)((long)pvVar1 + 0x24) <= iVar7)) break;
    lVar4 = 0;
    while (lVar4 < 1 << (*(byte *)(__ptr + lVar3 + 0x30) & 0x1f)) {
      lVar5 = oggpack_read(opb,8);
      iVar7 = (uint)lVar5 - 1;
      piVar12[lVar4] = iVar7;
      if ((0x80000000 < (uint)lVar5) || (lVar4 = lVar4 + 1, *(int *)((long)pvVar1 + 0x24) <= iVar7))
      goto LAB_00130eb6;
    }
    lVar3 = lVar3 + 1;
    piVar12 = piVar12 + 8;
  }
LAB_00130eb6:
  free(__ptr);
  return (vorbis_info_floor *)0x0;
}

Assistant:

static vorbis_info_floor *floor1_unpack (vorbis_info *vi,oggpack_buffer *opb){
  codec_setup_info     *ci=(codec_setup_info *)vi->codec_setup;
  int j,k,count=0,maxclass=-1,rangebits;

  vorbis_info_floor1 *info=(vorbis_info_floor1 *)_ogg_calloc(1,sizeof(*info));
  /* read partitions */
  info->partitions=oggpack_read(opb,5); /* only 0 to 31 legal */
  for(j=0;j<info->partitions;j++){
    info->partitionclass[j]=oggpack_read(opb,4); /* only 0 to 15 legal */
    if(maxclass<info->partitionclass[j])maxclass=info->partitionclass[j];
  }

  /* read partition classes */
  for(j=0;j<maxclass+1;j++){
    info->class_dim[j]=oggpack_read(opb,3)+1; /* 1 to 8 */
    info->class_subs[j]=oggpack_read(opb,2); /* 0,1,2,3 bits */
    if(info->class_subs[j]<0)
      goto err_out;
    if(info->class_subs[j])info->class_book[j]=oggpack_read(opb,8);
    if(info->class_book[j]<0 || info->class_book[j]>=ci->books)
      goto err_out;
    for(k=0;k<(1<<info->class_subs[j]);k++){
      info->class_subbook[j][k]=oggpack_read(opb,8)-1;
      if(info->class_subbook[j][k]<-1 || info->class_subbook[j][k]>=ci->books)
	goto err_out;
    }
  }

  /* read the post list */
  info->mult=oggpack_read(opb,2)+1;     /* only 1,2,3,4 legal now */ 
  rangebits=oggpack_read(opb,4);

  for(j=0,k=0;j<info->partitions;j++){
    count+=info->class_dim[info->partitionclass[j]]; 
    for(;k<count;k++){
      int t=info->postlist[k+2]=oggpack_read(opb,rangebits);
      if(t<0 || t>=(1<<rangebits))
	goto err_out;
    }
  }
  info->postlist[0]=0;
  info->postlist[1]=1<<rangebits;

  return(info);
  
 err_out:
  floor1_free_info(info);
  return(NULL);
}